

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O0

Node * __thiscall
llbuild::ninja::Manifest::findNode(Manifest *this,StringRef workingDirectory,StringRef path0)

{
  bool bVar1;
  StringMapEntry<llbuild::ninja::Node_*> *pSVar2;
  SmallVectorImpl<char> *tmp;
  StringRef workingDirectory_00;
  StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
  local_190;
  StringRef local_188;
  StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
  local_178;
  iterator it;
  undefined1 local_148 [8];
  SmallString<256U> absPathTmp;
  Manifest *this_local;
  StringRef path0_local;
  StringRef workingDirectory_local;
  
  tmp = (SmallVectorImpl<char> *)path0.Data;
  absPathTmp.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       this;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_148,path0);
  workingDirectory_00.Length = (size_t)local_148;
  workingDirectory_00.Data = (char *)workingDirectory.Length;
  bVar1 = normalize_path((Manifest *)workingDirectory.Data,workingDirectory_00,tmp);
  if (bVar1) {
    local_188 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_148);
    local_178.Ptr =
         (StringMapEntryBase **)
         llvm::StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator>::find
                   (&this->nodes,local_188);
    local_190.Ptr =
         (StringMapEntryBase **)
         llvm::StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator>::end(&this->nodes);
    bVar1 = llvm::
            StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
            ::operator==(&local_178,(StringMapIterator<llbuild::ninja::Node_*> *)&local_190);
    if (bVar1) {
      workingDirectory_local.Length = 0;
    }
    else {
      pSVar2 = llvm::
               iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Node_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Node_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Node_*>_*,_llvm::StringMapEntry<llbuild::ninja::Node_*>_&>
               ::operator->((iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Node_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Node_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Node_*>_*,_llvm::StringMapEntry<llbuild::ninja::Node_*>_&>
                             *)&local_178);
      workingDirectory_local.Length = (size_t)pSVar2->second;
    }
  }
  else {
    workingDirectory_local.Length = 0;
  }
  it.
  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
  .Ptr._4_4_ = 1;
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_148);
  return (Node *)workingDirectory_local.Length;
}

Assistant:

Node* Manifest::findNode(StringRef workingDirectory, StringRef path0) {
  SmallString<256> absPathTmp = path0;
  if (!normalize_path(workingDirectory, absPathTmp)) {
    return nullptr;
  }

  auto it = nodes.find(absPathTmp);
  if (it == nodes.end()) {
    return nullptr;
  }
  return it->second;
}